

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

void * google::protobuf::internal::TcParser::MaybeGetSplitBase
                 (MessageLite *msg,bool is_split,TcParseTableBase *table)

{
  void *__src;
  uint32_t uVar1;
  MessageLite *x;
  void **ppvVar2;
  Arena *this;
  undefined8 local_58;
  Arena *arena;
  uint32_t size;
  void **split;
  void *default_split;
  MessageLite *pMStack_28;
  uint32_t split_offset;
  void *out;
  TcParseTableBase *table_local;
  bool is_split_local;
  MessageLite *msg_local;
  
  pMStack_28 = msg;
  if (is_split) {
    uVar1 = anon_unknown_104::GetSplitOffset(table);
    x = TcParseTableBase::default_instance(table);
    ppvVar2 = RefAt<void*>(x,(ulong)uVar1);
    __src = *ppvVar2;
    ppvVar2 = RefAt<void*>(msg,(ulong)uVar1);
    if (*ppvVar2 == __src) {
      uVar1 = anon_unknown_104::GetSizeofSplit(table);
      this = MessageLite::GetArena(msg);
      if (this == (Arena *)0x0) {
        local_58 = operator_new((ulong)uVar1);
      }
      else {
        local_58 = Arena::AllocateAligned(this,(ulong)uVar1,8);
      }
      *ppvVar2 = local_58;
      memcpy(*ppvVar2,__src,(ulong)uVar1);
    }
    pMStack_28 = (MessageLite *)*ppvVar2;
  }
  return pMStack_28;
}

Assistant:

void* TcParser::MaybeGetSplitBase(MessageLite* msg, const bool is_split,
                                  const TcParseTableBase* table) {
  void* out = msg;
  if (is_split) {
    const uint32_t split_offset = GetSplitOffset(table);
    void* default_split =
        TcParser::RefAt<void*>(table->default_instance(), split_offset);
    void*& split = TcParser::RefAt<void*>(msg, split_offset);
    if (split == default_split) {
      // Allocate split instance when needed.
      uint32_t size = GetSizeofSplit(table);
      Arena* arena = msg->GetArena();
      split = (arena == nullptr) ? ::operator new(size)
                                 : arena->AllocateAligned(size);
      memcpy(split, default_split, size);
    }
    out = split;
  }
  return out;
}